

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O2

void fnode_service_notify_state(fnode_service_t *svc,char *state,uint32_t size)

{
  uint uVar1;
  _Bool _Var2;
  size_t sVar3;
  char local_434 [4];
  undefined8 local_430;
  undefined1 local_428 [1024];
  
  if (svc != (fnode_service_t *)0x0) {
    sVar3 = fnode_service_time();
    memset(local_428,0,0x400);
    builtin_strncpy(local_434,"DATA",4);
    local_430 = *(undefined8 *)svc->sn;
    uVar1 = 0x400;
    if (size < 0x400) {
      uVar1 = size;
    }
    memcpy(local_428,state,(ulong)uVar1);
    _Var2 = fnet_socket_sendto(svc->socket,local_434,0x40c,&svc->server);
    if (_Var2) {
      svc->last_cmd_time = sVar3;
    }
  }
  return;
}

Assistant:

void fnode_service_notify_state(fnode_service_t *svc, char const state[FMAX_DATA_LENGTH], uint32_t size)
{
    if (svc)
    {
        size_t time_now = fnode_service_time();

        fcmd_node_status cmd = {{ FCMD_CHARS(FCMD_DATA) }};
        memcpy(cmd.sn,       svc->sn,       sizeof svc->sn);
        memcpy(cmd.data,     state,         size > FMAX_DATA_LENGTH ? FMAX_DATA_LENGTH : size);

        if (fnet_socket_sendto(svc->socket, (const char *)&cmd, sizeof cmd, &svc->server))
            svc->last_cmd_time = time_now;
    }
}